

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  reference ppcVar4;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_00;
  reference ppcVar5;
  ostream *poVar6;
  string local_2f0;
  cmGeneratorTarget *local_2d0;
  cmGeneratorTarget *tgt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *tgts;
  cmLocalGenerator *lg;
  iterator __end1;
  iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  cmGeneratedFileStream fout;
  undefined1 local_30 [8];
  string fname;
  cmGlobalGenerator *this_local;
  
  fname.field_2._8_8_ = this;
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  std::__cxx11::string::string((string *)local_30,(string *)psVar3);
  std::__cxx11::string::operator+=((string *)local_30,"/CMakeFiles");
  std::__cxx11::string::operator+=((string *)local_30,"/TargetDirectories.txt");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&__range1,(string *)local_30,false,None);
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                     (&this->LocalGenerators);
  lg = (cmLocalGenerator *)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                 (&this->LocalGenerators);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                     *)&lg), bVar1) {
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    this_00 = cmLocalGenerator::GetGeneratorTargets(*ppcVar4);
    __end2 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_00);
    tgt = (cmGeneratorTarget *)
          std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                       *)&tgt), bVar1) {
      ppcVar5 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&__end2);
      local_2d0 = *ppcVar5;
      TVar2 = cmGeneratorTarget::GetType(local_2d0);
      if (TVar2 != INTERFACE_LIBRARY) {
        WriteSummary(this,local_2d0);
        cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_2f0,local_2d0);
        poVar6 = std::operator<<((ostream *)&__range1,(string *)&local_2f0);
        std::operator<<(poVar6,"\n");
        std::__cxx11::string::~string((string *)&local_2f0);
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range1);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary()
{
  // Record all target directories in a central location.
  std::string fname = this->CMakeInstance->GetHomeOutputDirectory();
  fname += "/CMakeFiles";
  fname += "/TargetDirectories.txt";
  cmGeneratedFileStream fout(fname);

  for (cmLocalGenerator* lg : this->LocalGenerators) {
    const std::vector<cmGeneratorTarget*>& tgts = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* tgt : tgts) {
      if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }
      this->WriteSummary(tgt);
      fout << tgt->GetSupportDirectory() << "\n";
    }
  }
}